

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_2f151d::Db::parseBinaryExpr(Db *this,StringView Kind)

{
  Node *local_38;
  Node *RHS;
  Node *LHS;
  Db *this_local;
  StringView Kind_local;
  
  Kind_local.First = Kind.Last;
  this_local = (Db *)Kind.First;
  LHS = (Node *)this;
  RHS = parseExpr(this);
  if (RHS == (Node *)0x0) {
    Kind_local.Last = (char *)0x0;
  }
  else {
    local_38 = parseExpr(this);
    if (local_38 == (Node *)0x0) {
      Kind_local.Last = (char *)0x0;
    }
    else {
      Kind_local.Last =
           (char *)(anonymous_namespace)::Db::
                   make<(anonymous_namespace)::BinaryExpr,(anonymous_namespace)::Node*&,StringView&,(anonymous_namespace)::Node*&>
                             ((Db *)this,&RHS,(StringView *)&this_local,&local_38);
    }
  }
  return (Node *)Kind_local.Last;
}

Assistant:

Node *Db::parseBinaryExpr(StringView Kind) {
  Node *LHS = parseExpr();
  if (LHS == nullptr)
    return nullptr;
  Node *RHS = parseExpr();
  if (RHS == nullptr)
    return nullptr;
  return make<BinaryExpr>(LHS, Kind, RHS);
}